

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

int64 __thiscall TTD::EventLog::GetFirstEventTimeInLog(EventLog *this)

{
  bool bVar1;
  int64 iVar2;
  undefined1 local_38 [8];
  Iterator iter;
  
  TTEventList::GetIteratorAtFirst((Iterator *)local_38,&this->m_eventList);
  if (local_38 != (undefined1  [8])0x0) {
    do {
      if (iter.m_currLink < *(TTEventListLink **)((long)local_38 + 8)) {
        return -1;
      }
      if ((TTEventListLink *)*(size_t *)local_38 <= iter.m_currLink) {
        return -1;
      }
      bVar1 = NSLogEvents::IsJsRTActionRootCall
                        ((EventLogEntry *)
                         (*(byte **)((long)local_38 + 0x10) + (long)&(iter.m_currLink)->CurrPos));
      if (bVar1) {
        if (((local_38 != (undefined1  [8])0x0) &&
            (*(TTEventListLink **)((long)local_38 + 8) <= iter.m_currLink)) &&
           (iter.m_currLink < (TTEventListLink *)*(size_t *)local_38)) {
          iVar2 = NSLogEvents::GetTimeFromRootCallOrSnapshot
                            ((EventLogEntry *)
                             (*(byte **)((long)local_38 + 0x10) + (long)&(iter.m_currLink)->CurrPos)
                            );
          return iVar2;
        }
        TTDAbort_unrecoverable_error("Iterator is invalid!!!");
      }
      TTEventList::Iterator::MoveNext((Iterator *)local_38);
    } while (local_38 != (undefined1  [8])0x0);
  }
  return -1;
}

Assistant:

int64 EventLog::GetFirstEventTimeInLog() const
    {
        for(auto iter = this->m_eventList.GetIteratorAtFirst(); iter.IsValid(); iter.MoveNext())
        {
            if(NSLogEvents::IsJsRTActionRootCall(iter.Current()))
            {
                return NSLogEvents::GetTimeFromRootCallOrSnapshot(iter.Current());
            }
        }

        return -1;
    }